

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerGLSL::register_impure_function_call(CompilerGLSL *this)

{
  size_t sVar1;
  uint *puVar2;
  SPIRVariable *pSVar3;
  long lVar4;
  
  sVar1 = (this->super_Compiler).global_variables.super_VectorView<unsigned_int>.buffer_size;
  if (sVar1 != 0) {
    puVar2 = (this->super_Compiler).global_variables.super_VectorView<unsigned_int>.ptr;
    lVar4 = 0;
    do {
      pSVar3 = Variant::get<spirv_cross::SPIRVariable>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)((long)puVar2 + lVar4));
      Compiler::flush_dependees(&this->super_Compiler,pSVar3);
      lVar4 = lVar4 + 4;
    } while (sVar1 << 2 != lVar4);
  }
  sVar1 = (this->super_Compiler).aliased_variables.super_VectorView<unsigned_int>.buffer_size;
  if (sVar1 != 0) {
    puVar2 = (this->super_Compiler).aliased_variables.super_VectorView<unsigned_int>.ptr;
    lVar4 = 0;
    do {
      pSVar3 = Variant::get<spirv_cross::SPIRVariable>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)((long)puVar2 + lVar4));
      Compiler::flush_dependees(&this->super_Compiler,pSVar3);
      lVar4 = lVar4 + 4;
    } while (sVar1 << 2 != lVar4);
  }
  return;
}

Assistant:

void CompilerGLSL::register_impure_function_call()
{
	// Impure functions can modify globals and aliased variables, so invalidate them as well.
	for (auto global : global_variables)
		flush_dependees(get<SPIRVariable>(global));
	for (auto aliased : aliased_variables)
		flush_dependees(get<SPIRVariable>(aliased));
}